

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadsave.cpp
# Opt level: O2

void load0(char *filename)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  char *pcVar8;
  float fVar9;
  Am_Value AStack_268;
  Am_String h;
  ifstream in_file;
  byte abStack_210 [488];
  
  std::ifstream::ifstream(&in_file,filename,_S_in);
  if ((abStack_210[*(long *)(_in_file + -0x18)] & 5) == 0) {
    Am_Load_Save_Context::Reset();
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    iVar5 = Am_Value::operator_cast_to_int(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    lVar7 = Am_Value::operator_cast_to_long(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    bVar2 = Am_Value::operator_cast_to_bool(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    bVar3 = Am_Value::operator_cast_to_bool(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    fVar9 = Am_Value::operator_cast_to_float(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    dVar1 = Am_Value::operator_cast_to_double(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    cVar4 = Am_Value::operator_cast_to_char(&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    Am_Load_Save_Context::Load((istream *)&AStack_268);
    Am_String::Am_String(&h,&AStack_268);
    Am_Value::~Am_Value(&AStack_268);
    pcVar8 = "Test 0 failed";
    if (((((bVar2 && !bVar3) && (lVar7 == 0x44fc16 && iVar5 == 5)) &&
         (ABS(fVar9 + -54.234) < 0.0001)) && (ABS(dVar1 + -123.344) < 0.0001)) && (cVar4 == 'a')) {
      cVar4 = Am_String::operator==(&h,"Hello this is a test to see what\n happens");
      pcVar8 = "Test 0 failed";
      if (cVar4 != '\0') {
        pcVar8 = "Test 0 okay";
      }
    }
    poVar6 = std::operator<<((ostream *)&std::cout,pcVar8);
    std::endl<char,std::char_traits<char>>(poVar6);
    Am_String::~Am_String(&h);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"open failed");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::ifstream::~ifstream(&in_file);
  return;
}

Assistant:

void
load0(const char *filename)
{
  // open the file
  std::ifstream in_file(filename, std::ios::in);
  if (!in_file) {
    std::cout << "open failed" << std::endl;
    return;
  }

  // reset internal reference counters etc. (should always be done for new stream)
  Am_Default_Load_Save_Context.Reset();

  // read-back with in same order
  int a = Am_Default_Load_Save_Context.Load(in_file);
  long b = Am_Default_Load_Save_Context.Load(in_file);
  bool c = Am_Default_Load_Save_Context.Load(in_file);
  bool d = Am_Default_Load_Save_Context.Load(in_file);
  float e = Am_Default_Load_Save_Context.Load(in_file);
  double f = Am_Default_Load_Save_Context.Load(in_file);
  char g = Am_Default_Load_Save_Context.Load(in_file);
  Am_String h = Am_Default_Load_Save_Context.Load(in_file);

  // now do the check, that we read back the correct values
  if (a == 5 && b == 4520982 && c && !d && (fabs(e - 54.234) < 0.0001) &&
      (fabs(f - 123.344) < 0.0001) && g == 'a' &&
      h == "Hello this is a test to see what\n happens") {
    // everything is ok
    std::cout << "Test 0 okay" << std::endl;
  } else {
    // ups, there is a problem
    std::cout << "Test 0 failed" << std::endl;
  }
}